

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmRestrictions.cpp
# Opt level: O0

void __thiscall
GmmLib::GmmTextureCalc::GetResRestrictions
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexinfo,__GMM_BUFFER_TYPE *Restrictions)

{
  uint32_t uVar1;
  uint32_t uVar2;
  WA_TABLE *pWVar3;
  SKU_FEATURE_TABLE *pSVar4;
  int local_70;
  int local_68;
  int local_5c;
  uint32_t local_54;
  anon_struct_8_45_9b07292e_for_Gpu local_3c;
  GMM_RESOURCE_FLAG ZeroGpuFlags;
  GMM_PLATFORM_INFO *pPlatform;
  __GMM_BUFFER_TYPE *Restrictions_local;
  GMM_TEXTURE_INFO *pTexinfo_local;
  GmmTextureCalc *this_local;
  
  ZeroGpuFlags.Info._4_4_ = 0;
  ZeroGpuFlags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
  if (this->pGmmLibContext != (Context *)0x0) {
    ZeroGpuFlags._12_8_ = GmmGetPlatformInfo(this->pGmmLibContext);
    memset(&local_3c,0,8);
    if (((7 < (int)pTexinfo->Type) && ((int)pTexinfo->Type < 0x1b)) ||
       ((pTexinfo->Flags).Gpu != local_3c)) {
      ResetRestrictions(this,Restrictions);
      switch(pTexinfo->Type) {
      case RESOURCE_1D:
      case RESOURCE_2D:
      case RESOURCE_3D:
      case RESOURCE_CUBE:
      case RESOURCE_SCRATCH:
      case RESOURCE_BUFFER:
      case RESOURCE_GDI:
        (*this->_vptr_GmmTextureCalc[1])(this,pTexinfo,Restrictions);
        break;
      default:
        (*this->_vptr_GmmTextureCalc[1])(this,pTexinfo,Restrictions);
        break;
      case RESOURCE_PRIMARY:
      case RESOURCE_SHADOW:
      case RESOURCE_STAGING:
        (*this->_vptr_GmmTextureCalc[5])(this,pTexinfo,Restrictions);
        break;
      case RESOURCE_CURSOR:
      case RESOURCE_FBC:
      case RESOURCE_PWR_CONTEXT:
      case RESOURCE_PERF_DATA_QUEUE:
      case RESOURCE_KMD_BUFFER:
      case RESOURCE_GLOBAL_BUFFER:
      case RESOURCE_NULL_CONTEXT_INDIRECT_STATE:
      case RESOURCE_GFX_CLIENT_BUFFER:
        memcpy(Restrictions,(void *)(ZeroGpuFlags._12_8_ + 0x8c0),0x60);
        break;
      case RESOURCE_HW_CONTEXT:
      case RESOURCE_TAG_PAGE:
        if (((ulong)(pTexinfo->Flags).Info >> 0x22 & 1) != 0) {
          return;
        }
        if (((ulong)(pTexinfo->Flags).Info >> 0x23 & 1) != 0) {
          return;
        }
        if (((ulong)(pTexinfo->Flags).Info >> 0x24 & 1) != 0) {
          return;
        }
        if (((ulong)(pTexinfo->Flags).Info >> 0x2b & 1) != 0) {
          return;
        }
        (*this->_vptr_GmmTextureCalc[4])(this,pTexinfo,Restrictions);
        break;
      case RESOURCE_NNDI:
        memcpy(Restrictions,(void *)(ZeroGpuFlags._12_8_ + 0x680),0x60);
        break;
      case RESOURCE_HARDWARE_MBM:
      case RESOURCE_IFFS_MAPTOGTT:
        if (((ulong)(pTexinfo->Flags).Gpu >> 0x13 & 1) == 0) {
          memcpy(Restrictions,(void *)(ZeroGpuFlags._12_8_ + 0x740),0x60);
        }
        else {
          memcpy(Restrictions,(void *)(ZeroGpuFlags._12_8_ + 0x620),0x60);
        }
        break;
      case RESOURCE_OVERLAY_DMA:
        memcpy(Restrictions,(void *)(ZeroGpuFlags._12_8_ + 0x920),0x60);
        break;
      case RESOURCE_OVERLAY_INTERMEDIATE_SURFACE:
        memcpy(Restrictions,(void *)(ZeroGpuFlags._12_8_ + 0x620),0x60);
        break;
      case RESOURCE_GTT_TRANSFER_REGION:
        (*this->_vptr_GmmTextureCalc[1])(this,pTexinfo,Restrictions);
      }
      if (((*(ushort *)&(pTexinfo->Flags).Wa >> 1 & 1) != 0) ||
         ((*(ushort *)&(pTexinfo->Flags).Wa >> 2 & 1) != 0)) {
        Restrictions->Alignment =
             (Restrictions->Alignment + 0x7fff) - (Restrictions->Alignment + 0x7fff & 0x7fff);
      }
      pWVar3 = Context::GetWaTable(this->pGmmLibContext);
      if (((*(ulong *)&pWVar3->field_0x4 >> 5 & 1) != 0) && (pTexinfo->Type == RESOURCE_HW_CONTEXT))
      {
        Restrictions->Alignment =
             (Restrictions->Alignment + 0xffff) - (Restrictions->Alignment + 0xffff & 0xffff);
      }
      if (((((ulong)(pTexinfo->Flags).Gpu >> 0x18 & 1) != 0) &&
          (((ulong)(pTexinfo->Flags).Info >> 0x13 & 1) != 0)) &&
         (pSVar4 = Context::GetSkuTable(this->pGmmLibContext),
         (*(byte *)&pSVar4->field_5 >> 1 & 1) == 0)) {
        Restrictions->Alignment = 0x1000;
        Restrictions->PitchAlignment = 0x1000;
      }
      if ((((ulong)(pTexinfo->Flags).Gpu >> 0x23 & 1) != 0) &&
         (Restrictions->Alignment =
               (Restrictions->Alignment + 0xffff) - (Restrictions->Alignment + 0xffff & 0xffff),
         pTexinfo->Type == RESOURCE_BUFFER)) {
        Restrictions->PitchAlignment =
             (Restrictions->PitchAlignment + 0xffff) -
             (Restrictions->PitchAlignment + 0xffff & 0xffff);
      }
      if (((pTexinfo->Type == RESOURCE_PRIMARY) || (((ulong)(pTexinfo->Flags).Gpu >> 7 & 1) != 0))
         && ((((ulong)(pTexinfo->Flags).Info >> 0x24 & 1) != 0 ||
             ((((ulong)(pTexinfo->Flags).Info >> 0x2b & 1) != 0 ||
              (((ulong)(pTexinfo->Flags).Info >> 0x25 & 1) != 0)))))) {
        Restrictions->Alignment = 0x100000;
      }
      if (((((ulong)(pTexinfo->Flags).Info >> 0x1d & 1) != 0) ||
          (((ulong)(pTexinfo->Flags).Info >> 0x14 & 1) != 0)) ||
         ((pSVar4 = Context::GetSkuTable(this->pGmmLibContext),
          ((ulong)pSVar4->field_1 >> 0x22 & 1) != 0 &&
          (((ulong)(pTexinfo->Flags).Info >> 0x2d & 1) == 0)))) {
        pSVar4 = Context::GetSkuTable(this->pGmmLibContext);
        if (((ulong)pSVar4->field_1 >> 0x19 & 1) == 0) {
          uVar1 = Restrictions->Alignment;
          pWVar3 = Context::GetWaTable(this->pGmmLibContext);
          if ((*(ulong *)&pWVar3->field_0x4 >> 0x2e & 1) == 0) {
            pWVar3 = Context::GetWaTable(this->pGmmLibContext);
            local_5c = 0x100000;
            if (((uint)((ulong)*(undefined8 *)&pWVar3->field_0x4 >> 0x2f) & 1) != 0) {
              local_5c = 0x10000;
            }
          }
          else {
            local_5c = 0x4000;
          }
          uVar2 = Restrictions->Alignment;
          pWVar3 = Context::GetWaTable(this->pGmmLibContext);
          if ((*(ulong *)&pWVar3->field_0x4 >> 0x2e & 1) == 0) {
            pWVar3 = Context::GetWaTable(this->pGmmLibContext);
            local_68 = 0x100000;
            if (((uint)((ulong)*(undefined8 *)&pWVar3->field_0x4 >> 0x2f) & 1) != 0) {
              local_68 = 0x10000;
            }
          }
          else {
            local_68 = 0x4000;
          }
          pWVar3 = Context::GetWaTable(this->pGmmLibContext);
          if ((*(ulong *)&pWVar3->field_0x4 >> 0x2e & 1) == 0) {
            pWVar3 = Context::GetWaTable(this->pGmmLibContext);
            local_70 = 0x100000;
            if (((uint)((ulong)*(undefined8 *)&pWVar3->field_0x4 >> 0x2f) & 1) != 0) {
              local_70 = 0x10000;
            }
          }
          else {
            local_70 = 0x4000;
          }
          Restrictions->Alignment =
               (uVar1 + local_5c + -1) - (uVar2 + local_68 + -1 & local_70 - 1U);
        }
        else {
          pSVar4 = Context::GetSkuTable(this->pGmmLibContext);
          if (((ulong)pSVar4->field_1 >> 0x22 & 1) == 0) {
            local_54 = (Restrictions->Alignment + 0x7f) - (Restrictions->Alignment + 0x7f & 0x7f);
          }
          else {
            local_54 = (Restrictions->Alignment + 0xff) - (Restrictions->Alignment + 0xff & 0xff);
          }
          Restrictions->Alignment = local_54;
        }
      }
    }
  }
  return;
}

Assistant:

void GmmLib::GmmTextureCalc::GetResRestrictions(GMM_TEXTURE_INFO * pTexinfo,
                                                __GMM_BUFFER_TYPE &Restrictions)
{
    GMM_DPF_ENTER;
    const GMM_PLATFORM_INFO *pPlatform = NULL;
    GMM_RESOURCE_FLAG        ZeroGpuFlags;

    __GMM_ASSERTPTR(pGmmLibContext, VOIDRETURN);

    pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexinfo, pGmmLibContext);

    // Check that at least one usage flag is set for allocations other than
    // Primary/Shadow/Staging.
    memset(&ZeroGpuFlags.Gpu, 0, sizeof(ZeroGpuFlags.Gpu));
    if((pTexinfo->Type <= RESOURCE_KMD_CHECK_START ||
        pTexinfo->Type >= RESOURCE_KMD_CHECK_END) &&
       !memcmp(&pTexinfo->Flags.Gpu, &ZeroGpuFlags.Gpu, sizeof(ZeroGpuFlags.Gpu)))
    {
        GMM_ASSERTDPF(0, "No GPU Usage specified!");
        return;
    }

    ResetRestrictions(&Restrictions); //Set to Default

    // Get worst case restrictions that match GPU flags set in resource
    switch(pTexinfo->Type)
    {
        case RESOURCE_1D:
        case RESOURCE_2D:
        case RESOURCE_3D:
        case RESOURCE_CUBE:
        case RESOURCE_BUFFER:
        case RESOURCE_SCRATCH:
        case RESOURCE_GDI:
            GetGenericRestrictions(pTexinfo, &Restrictions);
            break;

        case RESOURCE_HW_CONTEXT:
        case RESOURCE_TAG_PAGE:
            if(pTexinfo->Flags.Info.TiledW ||
               pTexinfo->Flags.Info.TiledX ||
               GMM_IS_4KB_TILE(pTexinfo->Flags))
            {
                GMM_ASSERTDPF(0, "Tiled Pref specified for RESOURCE_LINEAR!");
                return;
            }
            GetLinearRestrictions(pTexinfo, &Restrictions);
            break;

        case RESOURCE_PRIMARY:
        case RESOURCE_SHADOW:
        case RESOURCE_STAGING:
            GetPrimaryRestrictions(pTexinfo, &Restrictions);
            break;

        case RESOURCE_NNDI:
            Restrictions = pPlatform->Nndi;
            break;

        case RESOURCE_HARDWARE_MBM:
        case RESOURCE_IFFS_MAPTOGTT:
            //Hardware MBM resource request can come for overlay allocation or normal
            //displayable allocation. So get the restrictions accordingly
            if(pTexinfo->Flags.Gpu.Overlay)
            {
                Restrictions = pPlatform->Overlay;
            }
            else
            {
                Restrictions = pPlatform->HardwareMBM;
            }
            break;

        case RESOURCE_CURSOR:
        case RESOURCE_PWR_CONTEXT:
        case RESOURCE_KMD_BUFFER:
        case RESOURCE_NULL_CONTEXT_INDIRECT_STATE:
        case RESOURCE_PERF_DATA_QUEUE:
        case RESOURCE_GLOBAL_BUFFER:
        case RESOURCE_FBC:
        case RESOURCE_GFX_CLIENT_BUFFER:
            Restrictions = pPlatform->Cursor;
            break;

        case RESOURCE_OVERLAY_DMA:
            Restrictions = pPlatform->NoRestriction;
            break;

        case RESOURCE_GTT_TRANSFER_REGION:
            GetGenericRestrictions(pTexinfo, &Restrictions);
            break;

        case RESOURCE_OVERLAY_INTERMEDIATE_SURFACE:
            Restrictions = pPlatform->Overlay;
            break;

        default:
            GetGenericRestrictions(pTexinfo, &Restrictions);
            GMM_ASSERTDPF(0, "Unkown Resource type");
    }
    // Apply any specific WA

    if(((pTexinfo->Flags.Wa.ILKNeedAvcMprRowStore32KAlign)) ||
       ((pTexinfo->Flags.Wa.ILKNeedAvcDmvBuffer32KAlign)))
    {
        Restrictions.Alignment = GFX_ALIGN(Restrictions.Alignment, GMM_KBYTE(32));
    }

    if(pGmmLibContext->GetWaTable().WaAlignContextImage && (pTexinfo->Type == RESOURCE_HW_CONTEXT))
    {
        Restrictions.Alignment = GFX_ALIGN(Restrictions.Alignment, GMM_KBYTE(64));
    }

    if(pTexinfo->Flags.Gpu.S3d &&
       pTexinfo->Flags.Info.Linear &&
       !pGmmLibContext->GetSkuTable().FtrDisplayEngineS3d)
    {
        Restrictions.Alignment      = PAGE_SIZE;
        Restrictions.PitchAlignment = PAGE_SIZE;
    }

    if(pTexinfo->Flags.Gpu.TiledResource)
    {
        // Need at least 64KB alignment to track tile mappings (h/w or s/w tracking).
        Restrictions.Alignment = GFX_ALIGN(Restrictions.Alignment, GMM_KBYTE(64));

        // Buffer tiled resources are trivially divided into 64KB tiles => Pitch must divide into 64KB tiles
        if(pTexinfo->Type == RESOURCE_BUFFER)
        {
            Restrictions.PitchAlignment = GFX_ALIGN(Restrictions.PitchAlignment, GMM_KBYTE(64));
        }

    }

    // SKL TileY Display needs 1MB alignment.
    if(((pTexinfo->Type == RESOURCE_PRIMARY) ||
        pTexinfo->Flags.Gpu.FlipChain) &&
       (GMM_IS_4KB_TILE(pTexinfo->Flags) ||
        pTexinfo->Flags.Info.TiledYf))
    {
        Restrictions.Alignment = GMM_MBYTE(1);
    }

    if(pTexinfo->Flags.Info.RenderCompressed ||
        pTexinfo->Flags.Info.MediaCompressed || (pGmmLibContext->GetSkuTable().FtrXe2Compression && !pTexinfo->Flags.Info.NotCompressed))
    {
        if(pGmmLibContext->GetSkuTable().FtrFlatPhysCCS)
        {
            Restrictions.Alignment = pGmmLibContext->GetSkuTable().FtrXe2Compression ? GFX_ALIGN(Restrictions.Alignment, GMM_BYTES(256)) : GFX_ALIGN(Restrictions.Alignment, GMM_BYTES(128));
        }
        else // only for platforms having auxtable
        {
            Restrictions.Alignment = GFX_ALIGN(Restrictions.Alignment, (WA16K(pGmmLibContext) ? GMM_KBYTE(16) : WA64K(pGmmLibContext) ? GMM_KBYTE(64) : GMM_MBYTE(1)));
	    }
    }

    GMM_DPF_EXIT;
}